

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void __thiscall QDir::setNameFilters(QDir *this,QStringList *nameFilters)

{
  QDirPrivate *pQVar1;
  QList<QString> *in_RSI;
  QDirPrivate *d;
  
  pQVar1 = d_func((QDir *)0x27ecfc);
  QDirPrivate::clearCache((QDirPrivate *)this,nameFilters._4_4_);
  QList<QString>::operator=(in_RSI,(QList<QString> *)pQVar1);
  return;
}

Assistant:

void QDir::setNameFilters(const QStringList &nameFilters)
{
    Q_D(QDir);
    d->clearCache(QDirPrivate::KeepMetaData);
    d->nameFilters = nameFilters;
}